

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

void vkt::addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
               (TestCaseGroup *group,string *name,string *desc,Function initPrograms,
               Function testFunc,InstanceContext *arg0)

{
  InstanceContext *testFunction;
  Function initPrograms_00;
  Function desc_00;
  string *name_00;
  TestContext *testCtx;
  TestNode *node;
  InstanceContext local_118;
  InstanceContext *local_38;
  InstanceContext *arg0_local;
  Function testFunc_local;
  Function initPrograms_local;
  string *desc_local;
  string *name_local;
  TestCaseGroup *group_local;
  
  local_38 = arg0;
  arg0_local = (InstanceContext *)testFunc;
  testFunc_local = (Function)initPrograms;
  initPrograms_local = (Function)desc;
  desc_local = name;
  name_local = (string *)group;
  testCtx = tcu::TestNode::getTestContext(&group->super_TestNode);
  name_00 = desc_local;
  desc_00 = initPrograms_local;
  initPrograms_00 = testFunc_local;
  testFunction = arg0_local;
  SpirVAssembly::InstanceContext::InstanceContext(&local_118,arg0);
  node = (TestNode *)
         createFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                   (testCtx,NODETYPE_SELF_VALIDATE,name_00,(string *)desc_00,
                    (Function)initPrograms_00,(Function)testFunction,&local_118);
  tcu::TestNode::addChild(&group->super_TestNode,node);
  SpirVAssembly::InstanceContext::~InstanceContext(&local_118);
  return;
}

Assistant:

void addFunctionCaseWithPrograms (tcu::TestCaseGroup*							group,
								  const std::string&							name,
								  const std::string&							desc,
								  typename FunctionPrograms1<Arg0>::Function	initPrograms,
								  typename FunctionInstance1<Arg0>::Function	testFunc,
								  Arg0											arg0)
{
	group->addChild(createFunctionCaseWithPrograms<Arg0>(group->getTestContext(), tcu::NODETYPE_SELF_VALIDATE, name, desc, initPrograms, testFunc, arg0));
}